

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_14x14(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  int aiStack_1f8 [114];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  for (lVar24 = 0; (int)lVar24 != 8; lVar24 = lVar24 + 1) {
    lVar11 = (long)*(short *)((long)pvVar4 + lVar24 * 2) * (long)coef_block[lVar24] * 0x2000;
    lVar15 = (long)*(short *)((long)pvVar4 + lVar24 * 2 + 0x40) * (long)coef_block[lVar24 + 0x20];
    lVar32 = lVar15 * 0x28c6 + lVar11 + 0x400;
    lVar18 = lVar15 * 0xa12 + lVar11 + 0x400;
    lVar39 = lVar15 * -0x1c37 + lVar11 + 0x400;
    lVar12 = (long)*(short *)((long)pvVar4 + lVar24 * 2 + 0x20) * (long)coef_block[lVar24 + 0x10];
    lVar16 = (long)*(short *)((long)pvVar4 + lVar24 * 2 + 0x60) * (long)coef_block[lVar24 + 0x30];
    lVar7 = (lVar16 + lVar12) * 0x2362;
    lVar21 = lVar12 * 0x8bd + lVar7;
    lVar7 = lVar16 * -0x3704 + lVar7;
    lVar13 = lVar16 * -0x2c1f + lVar12 * 0x13a3;
    lVar12 = lVar21 + lVar32;
    lVar32 = lVar32 - lVar21;
    lVar16 = lVar7 + lVar18;
    lVar18 = lVar18 - lVar7;
    lVar7 = lVar13 + lVar39;
    lVar39 = lVar39 - lVar13;
    lVar13 = (long)*(short *)((long)pvVar4 + lVar24 * 2 + 0x10) * (long)coef_block[lVar24 + 8];
    lVar27 = (long)*(short *)((long)pvVar4 + lVar24 * 2 + 0x30) * (long)coef_block[lVar24 + 0x18];
    lVar22 = (long)*(short *)((long)pvVar4 + lVar24 * 2 + 0x50) * (long)coef_block[lVar24 + 0x28];
    lVar37 = (long)*(short *)((long)pvVar4 + lVar24 * 2 + 0x70) * (long)coef_block[lVar24 + 0x38];
    lVar21 = (lVar27 + lVar13) * 0x2ab7;
    lVar30 = (lVar22 + lVar13) * 0x2652;
    lVar33 = lVar13 * -0x2410 + lVar21 + lVar30 + lVar37 * 0x2000;
    lVar31 = (lVar22 + lVar27) * -0x511 + lVar37 * -0x2000;
    lVar17 = lVar27 * -0xd92 + lVar21 + lVar31;
    lVar31 = lVar22 * -0x4bf7 + lVar30 + lVar31;
    lVar30 = (lVar22 + lVar13) * 0x1814;
    lVar21 = (lVar13 - lVar27) * 0xef2 + lVar37 * -0x2000;
    lVar23 = (lVar22 - lVar27) * 0x2cf8;
    lVar40 = lVar37 * 0x2000 + lVar30 + lVar22 * -0x361a + lVar23;
    lVar30 = lVar13 * -0x21f5 + lVar30 + lVar21;
    lVar21 = lVar27 * 0x1599 + lVar23 + lVar21;
    iVar35 = (int)lVar37 + ((int)(lVar13 - lVar27) - (int)lVar22);
    aiStack_1f8[lVar24] = (int)((ulong)(lVar33 + lVar12) >> 0xb);
    aiStack_1f8[lVar24 + 0x68] = (int)((ulong)(lVar12 - lVar33) >> 0xb);
    aiStack_1f8[lVar24 + 8] = (int)((ulong)(lVar17 + lVar16) >> 0xb);
    aiStack_1f8[lVar24 + 0x60] = (int)((ulong)(lVar16 - lVar17) >> 0xb);
    aiStack_1f8[lVar24 + 0x10] = (int)((ulong)(lVar31 + lVar7) >> 0xb);
    aiStack_1f8[lVar24 + 0x58] = (int)((ulong)(lVar7 - lVar31) >> 0xb);
    iVar1 = (int)(lVar15 * -0x2d42 + lVar11 + 0x400U >> 0xb);
    aiStack_1f8[lVar24 + 0x18] = iVar1 + iVar35 * 4;
    aiStack_1f8[lVar24 + 0x50] = iVar1 + iVar35 * -4;
    aiStack_1f8[lVar24 + 0x20] = (int)((ulong)(lVar40 + lVar39) >> 0xb);
    aiStack_1f8[lVar24 + 0x48] = (int)((ulong)(lVar39 - lVar40) >> 0xb);
    aiStack_1f8[lVar24 + 0x28] = (int)((ulong)(lVar21 + lVar18) >> 0xb);
    aiStack_1f8[lVar24 + 0x40] = (int)((ulong)(lVar18 - lVar21) >> 0xb);
    aiStack_1f8[lVar24 + 0x30] = (int)((ulong)(lVar30 + lVar32) >> 0xb);
    aiStack_1f8[lVar24 + 0x38] = (int)((ulong)(lVar32 - lVar30) >> 0xb);
  }
  uVar41 = (ulong)output_col;
  for (lVar24 = 0; lVar24 != 0x70; lVar24 = lVar24 + 8) {
    iVar26 = aiStack_1f8[lVar24 + 1];
    iVar35 = aiStack_1f8[lVar24] * 0x2000;
    iVar1 = aiStack_1f8[lVar24 + 4];
    iVar25 = iVar35 + iVar1 * 0x28c6 + 0x20000;
    iVar28 = iVar35 + iVar1 * 0xa12 + 0x20000;
    iVar29 = iVar1 * -0x1c37 + iVar35 + 0x20000;
    iVar5 = iVar35 + iVar1 * -0x2d42 + 0x20000;
    iVar1 = aiStack_1f8[lVar24 + 2];
    iVar35 = aiStack_1f8[lVar24 + 6];
    iVar14 = (iVar35 + iVar1) * 0x2362;
    iVar19 = iVar1 * 0x8bd + iVar14;
    iVar14 = iVar35 * -0x3704 + iVar14;
    iVar8 = iVar35 * -0x2c1f + iVar1 * 0x13a3;
    iVar1 = iVar19 + iVar25;
    iVar25 = iVar25 - iVar19;
    iVar35 = iVar14 + iVar28;
    iVar28 = iVar28 - iVar14;
    iVar14 = iVar8 + iVar29;
    iVar29 = iVar29 - iVar8;
    iVar8 = aiStack_1f8[lVar24 + 3];
    iVar19 = aiStack_1f8[lVar24 + 5];
    iVar2 = aiStack_1f8[lVar24 + 7];
    iVar34 = ((iVar26 - iVar8) - iVar19) + iVar2;
    iVar9 = (iVar8 + iVar26) * 0x2ab7;
    iVar38 = (iVar19 + iVar26) * 0x2652;
    iVar6 = iVar26 * -0x2410 + iVar9 + iVar38 + iVar2 * 0x2000;
    iVar10 = (iVar19 + iVar8) * -0x511 + iVar2 * -0x2000;
    iVar9 = iVar8 * -0xd92 + iVar9 + iVar10;
    iVar10 = iVar19 * -0x4bf7 + iVar38 + iVar10;
    iVar36 = (iVar26 - iVar8) * 0xef2 + iVar2 * -0x2000;
    iVar38 = (iVar19 + iVar26) * 0x1814;
    iVar20 = (iVar19 - iVar8) * 0x2cf8;
    iVar19 = iVar19 * -0x361a + iVar2 * 0x2000 + iVar20 + iVar38;
    iVar26 = iVar26 * -0x21f5 + iVar38 + iVar36;
    iVar36 = iVar8 * 0x1599 + iVar20 + iVar36;
    lVar12 = *(long *)((long)output_buf + lVar24);
    *(JSAMPLE *)(lVar12 + uVar41) = pJVar3[(ulong)((uint)(iVar6 + iVar1) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xd + uVar41) =
         pJVar3[(ulong)((uint)(iVar1 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 1 + uVar41) =
         pJVar3[(ulong)((uint)(iVar9 + iVar35) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xc + uVar41) =
         pJVar3[(ulong)((uint)(iVar35 - iVar9) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 2 + uVar41) =
         pJVar3[(ulong)((uint)(iVar10 + iVar14) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xb + uVar41) =
         pJVar3[(ulong)((uint)(iVar14 - iVar10) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 3 + uVar41) =
         pJVar3[(ulong)((uint)(iVar34 * 0x2000 + iVar5) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 10 + uVar41) =
         pJVar3[(ulong)((uint)(iVar5 + iVar34 * -0x2000) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 4 + uVar41) =
         pJVar3[(ulong)((uint)(iVar19 + iVar29) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 9 + uVar41) =
         pJVar3[(ulong)((uint)(iVar29 - iVar19) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 5 + uVar41) =
         pJVar3[(ulong)((uint)(iVar28 + iVar36) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 8 + uVar41) =
         pJVar3[(ulong)((uint)(iVar28 - iVar36) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 6 + uVar41) =
         pJVar3[(ulong)((uint)(iVar26 + iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 7 + uVar41) =
         pJVar3[(ulong)((uint)(iVar25 - iVar26) >> 0x12 & 0x3ff) + 0x80];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_14x14(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 14];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z2 = MULTIPLY(z4, FIX(1.274162392));         /* c4 */
    z3 = MULTIPLY(z4, FIX(0.314692123));         /* c12 */
    z4 = MULTIPLY(z4, FIX(0.881747734));         /* c8 */

    tmp10 = z1 + z2;
    tmp11 = z1 + z3;
    tmp12 = z1 - z4;

    tmp23 = RIGHT_SHIFT(z1 - LEFT_SHIFT(z2 + z3 - z4, 1),
                        CONST_BITS - PASS1_BITS); /* c0 = (c4+c12-c8)*2 */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z3 = MULTIPLY(z1 + z2, FIX(1.105676686));    /* c6 */

    tmp13 = z3 + MULTIPLY(z1, FIX(0.273079590)); /* c2-c6 */
    tmp14 = z3 - MULTIPLY(z2, FIX(1.719280954)); /* c6+c10 */
    tmp15 = MULTIPLY(z1, FIX(0.613604268)) -     /* c10 */
            MULTIPLY(z2, FIX(1.378756276));      /* c2 */

    tmp20 = tmp10 + tmp13;
    tmp26 = tmp10 - tmp13;
    tmp21 = tmp11 + tmp14;
    tmp25 = tmp11 - tmp14;
    tmp22 = tmp12 + tmp15;
    tmp24 = tmp12 - tmp15;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp13 = LEFT_SHIFT(z4, CONST_BITS);

    tmp14 = z1 + z3;
    tmp11 = MULTIPLY(z1 + z2, FIX(1.334852607));           /* c3 */
    tmp12 = MULTIPLY(tmp14, FIX(1.197448846));             /* c5 */
    tmp10 = tmp11 + tmp12 + tmp13 - MULTIPLY(z1, FIX(1.126980169)); /* c3+c5-c1 */
    tmp14 = MULTIPLY(tmp14, FIX(0.752406978));             /* c9 */
    tmp16 = tmp14 - MULTIPLY(z1, FIX(1.061150426));        /* c9+c11-c13 */
    z1    -= z2;
    tmp15 = MULTIPLY(z1, FIX(0.467085129)) - tmp13;        /* c11 */
    tmp16 += tmp15;
    z1    += z4;
    z4    = MULTIPLY(z2 + z3, -FIX(0.158341681)) - tmp13;  /* -c13 */
    tmp11 += z4 - MULTIPLY(z2, FIX(0.424103948));          /* c3-c9-c13 */
    tmp12 += z4 - MULTIPLY(z3, FIX(2.373959773));          /* c3+c5-c13 */
    z4    = MULTIPLY(z3 - z2, FIX(1.405321284));           /* c1 */
    tmp14 += z4 + tmp13 - MULTIPLY(z3, FIX(1.6906431334)); /* c1+c9-c11 */
    tmp15 += z4 + MULTIPLY(z2, FIX(0.674957567));          /* c1+c11-c5 */

    tmp13 = LEFT_SHIFT(z1 - z3, PASS1_BITS);

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)(tmp23 + tmp13);
    wsptr[8 * 10] = (int)(tmp23 - tmp13);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp16, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp26 - tmp16, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 14 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 14; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z4 = (JLONG)wsptr[4];
    z2 = MULTIPLY(z4, FIX(1.274162392));         /* c4 */
    z3 = MULTIPLY(z4, FIX(0.314692123));         /* c12 */
    z4 = MULTIPLY(z4, FIX(0.881747734));         /* c8 */

    tmp10 = z1 + z2;
    tmp11 = z1 + z3;
    tmp12 = z1 - z4;

    tmp23 = z1 - LEFT_SHIFT(z2 + z3 - z4, 1);    /* c0 = (c4+c12-c8)*2 */

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[6];

    z3 = MULTIPLY(z1 + z2, FIX(1.105676686));    /* c6 */

    tmp13 = z3 + MULTIPLY(z1, FIX(0.273079590)); /* c2-c6 */
    tmp14 = z3 - MULTIPLY(z2, FIX(1.719280954)); /* c6+c10 */
    tmp15 = MULTIPLY(z1, FIX(0.613604268)) -     /* c10 */
            MULTIPLY(z2, FIX(1.378756276));      /* c2 */

    tmp20 = tmp10 + tmp13;
    tmp26 = tmp10 - tmp13;
    tmp21 = tmp11 + tmp14;
    tmp25 = tmp11 - tmp14;
    tmp22 = tmp12 + tmp15;
    tmp24 = tmp12 - tmp15;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];
    z4 = LEFT_SHIFT(z4, CONST_BITS);

    tmp14 = z1 + z3;
    tmp11 = MULTIPLY(z1 + z2, FIX(1.334852607));           /* c3 */
    tmp12 = MULTIPLY(tmp14, FIX(1.197448846));             /* c5 */
    tmp10 = tmp11 + tmp12 + z4 - MULTIPLY(z1, FIX(1.126980169)); /* c3+c5-c1 */
    tmp14 = MULTIPLY(tmp14, FIX(0.752406978));             /* c9 */
    tmp16 = tmp14 - MULTIPLY(z1, FIX(1.061150426));        /* c9+c11-c13 */
    z1    -= z2;
    tmp15 = MULTIPLY(z1, FIX(0.467085129)) - z4;           /* c11 */
    tmp16 += tmp15;
    tmp13 = MULTIPLY(z2 + z3, -FIX(0.158341681)) - z4;     /* -c13 */
    tmp11 += tmp13 - MULTIPLY(z2, FIX(0.424103948));       /* c3-c9-c13 */
    tmp12 += tmp13 - MULTIPLY(z3, FIX(2.373959773));       /* c3+c5-c13 */
    tmp13 = MULTIPLY(z3 - z2, FIX(1.405321284));           /* c1 */
    tmp14 += tmp13 + z4 - MULTIPLY(z3, FIX(1.6906431334)); /* c1+c9-c11 */
    tmp15 += tmp13 + MULTIPLY(z2, FIX(0.674957567));       /* c1+c11-c5 */

    tmp13 = LEFT_SHIFT(z1 - z3, CONST_BITS) + z4;

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}